

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O0

uint64_t exp_check(uint64_t *n,uint64_t *a,uint32_t bBits,uint64_t *b)

{
  uint64_t uVar1;
  long lVar2;
  uint64_t uVar3;
  ulong uVar4;
  undefined1 *puVar5;
  undefined8 uStack_300;
  undefined1 auStack_2f8 [8];
  undefined1 *local_2f0;
  uint64_t m;
  uint64_t m2;
  uint64_t blt_2;
  uint64_t beq_2;
  ulong uStack_2c0;
  uint32_t i_2;
  uint64_t acc;
  uint64_t res;
  uint64_t blt_1;
  uint64_t beq_1;
  ulong uStack_298;
  uint32_t i_1;
  uint64_t acc_1;
  uint32_t j;
  uint32_t i0;
  unsigned_long __vla_expr0;
  ulong local_278;
  uint64_t m1;
  ulong uStack_268;
  uint32_t bLen;
  uint64_t m00;
  uint64_t m10;
  uint64_t blt;
  uint64_t beq;
  ulong uStack_240;
  uint32_t i;
  uint64_t acc0;
  uint64_t m0;
  uint64_t bit0;
  uint64_t one [64];
  uint64_t *b_local;
  uint32_t bBits_local;
  uint64_t *a_local;
  uint64_t *n_local;
  
  puVar5 = auStack_2f8;
  uStack_300 = 0x2d9c4d;
  one[0x3f] = (uint64_t)b;
  memset(&bit0,0,0x200);
  uStack_300 = 0x2d9c60;
  memset(&bit0,0,0x200);
  bit0 = 1;
  m0 = *n & 1;
  acc0 = -m0;
  uStack_240 = 0;
  for (beq._4_4_ = 0; beq._4_4_ < 0x40; beq._4_4_ = beq._4_4_ + 1) {
    uStack_300 = 0x2d9cd0;
    blt = FStar_UInt64_eq_mask(one[(ulong)beq._4_4_ - 1],n[beq._4_4_]);
    uStack_300 = 0x2d9cf8;
    uVar3 = FStar_UInt64_gte_mask(one[(ulong)beq._4_4_ - 1],n[beq._4_4_]);
    m10 = uVar3 ^ 0xffffffffffffffff;
    uStack_240 = blt & uStack_240 | (blt ^ 0xffffffffffffffff) & m10;
  }
  m00 = uStack_240;
  uStack_268 = acc0 & uStack_240;
  if (bBits == 0) {
    m1._4_4_ = 1;
  }
  else {
    m1._4_4_ = (bBits - 1 >> 6) + 1;
  }
  if (bBits < m1._4_4_ << 6) {
    if (0x1fffffffffffffff < (ulong)m1._4_4_) {
      uStack_300 = 0x2d9de6;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum4096.c"
             ,0x1fd);
      uStack_300 = 0x2d9df0;
      exit(0xfd);
    }
    _j = (ulong)m1._4_4_;
    lVar2 = -(_j * 8 + 0xf & 0xfffffffffffffff0);
    uVar4 = (ulong)m1._4_4_;
    local_2f0 = auStack_2f8 + lVar2;
    __vla_expr0 = (unsigned_long)auStack_2f8;
    *(undefined8 *)(auStack_2f8 + lVar2 + -8) = 0x2d9e38;
    memset(auStack_2f8 + lVar2,0,uVar4 << 3);
    acc_1._4_4_ = bBits >> 6;
    acc_1._0_4_ = bBits & 0x3f;
    *(ulong *)(local_2f0 + (ulong)acc_1._4_4_ * 8) =
         *(ulong *)(local_2f0 + (ulong)acc_1._4_4_ * 8) | 1L << (sbyte)(uint)acc_1;
    uStack_298 = 0;
    for (beq_1._4_4_ = 0; beq_1._4_4_ < m1._4_4_; beq_1._4_4_ = beq_1._4_4_ + 1) {
      uVar3 = *(uint64_t *)(one[0x3f] + (ulong)beq_1._4_4_ * 8);
      uVar1 = *(uint64_t *)(local_2f0 + (ulong)beq_1._4_4_ * 8);
      *(undefined8 *)(auStack_2f8 + lVar2 + -8) = 0x2d9eca;
      blt_1 = FStar_UInt64_eq_mask(uVar3,uVar1);
      uVar3 = *(uint64_t *)(one[0x3f] + (ulong)beq_1._4_4_ * 8);
      uVar1 = *(uint64_t *)(local_2f0 + (ulong)beq_1._4_4_ * 8);
      *(undefined8 *)(auStack_2f8 + lVar2 + -8) = 0x2d9ef8;
      uVar3 = FStar_UInt64_gte_mask(uVar3,uVar1);
      res = uVar3 ^ 0xffffffffffffffff;
      uStack_298 = blt_1 & uStack_298 | (blt_1 ^ 0xffffffffffffffff) & res;
    }
    acc = uStack_298;
    local_278 = uStack_298;
    puVar5 = (undefined1 *)__vla_expr0;
  }
  else {
    local_278 = 0xffffffffffffffff;
  }
  uStack_2c0 = 0;
  for (beq_2._4_4_ = 0; beq_2._4_4_ < 0x40; beq_2._4_4_ = beq_2._4_4_ + 1) {
    uVar3 = a[beq_2._4_4_];
    uVar1 = n[beq_2._4_4_];
    *(undefined8 *)(puVar5 + -8) = 0x2d9fd0;
    blt_2 = FStar_UInt64_eq_mask(uVar3,uVar1);
    uVar3 = a[beq_2._4_4_];
    uVar1 = n[beq_2._4_4_];
    *(undefined8 *)(puVar5 + -8) = 0x2d9ff8;
    uVar3 = FStar_UInt64_gte_mask(uVar3,uVar1);
    m2 = uVar3 ^ 0xffffffffffffffff;
    uStack_2c0 = blt_2 & uStack_2c0 | (blt_2 ^ 0xffffffffffffffff) & m2;
  }
  return uStack_268 & local_278 & uStack_2c0;
}

Assistant:

static uint32_t exp_check(uint32_t *n, uint32_t *a, uint32_t bBits, uint32_t *b)
{
  uint32_t one[8U] = { 0U };
  memset(one, 0U, 8U * sizeof (uint32_t));
  one[0U] = 1U;
  uint32_t bit0 = n[0U] & 1U;
  uint32_t m0 = 0U - bit0;
  uint32_t acc0 = 0U;
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t beq = FStar_UInt32_eq_mask(one[i], n[i]);
    uint32_t blt = ~FStar_UInt32_gte_mask(one[i], n[i]);
    acc0 = (beq & acc0) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U))););
  uint32_t m10 = acc0;
  uint32_t m00 = m0 & m10;
  uint32_t bLen;
  if (bBits == 0U)
  {
    bLen = 1U;
  }
  else
  {
    bLen = (bBits - 1U) / 32U + 1U;
  }
  uint32_t m1;
  if (bBits < 32U * bLen)
  {
    KRML_CHECK_SIZE(sizeof (uint32_t), bLen);
    uint32_t b2[bLen];
    memset(b2, 0U, bLen * sizeof (uint32_t));
    uint32_t i0 = bBits / 32U;
    uint32_t j = bBits % 32U;
    b2[i0] = b2[i0] | 1U << j;
    uint32_t acc = 0U;
    for (uint32_t i = 0U; i < bLen; i++)
    {
      uint32_t beq = FStar_UInt32_eq_mask(b[i], b2[i]);
      uint32_t blt = ~FStar_UInt32_gte_mask(b[i], b2[i]);
      acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U)));
    }
    uint32_t res = acc;
    m1 = res;
  }
  else
  {
    m1 = 0xFFFFFFFFU;
  }
  uint32_t acc = 0U;
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t beq = FStar_UInt32_eq_mask(a[i], n[i]);
    uint32_t blt = ~FStar_UInt32_gte_mask(a[i], n[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U))););
  uint32_t m2 = acc;
  uint32_t m = m1 & m2;
  return m00 & m;
}